

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBase::InitializeKeyValue(MapFieldBase *this,MessageLite *msg)

{
  Message *default_entry;
  MessageLite *msg_00;
  ClassData *this_00;
  Arena *arena;
  MessageLite *msg_local;
  MapFieldBase *this_local;
  
  default_entry = GetPrototype(this);
  msg_00 = &GetMapEntryValuePrototype(default_entry)->super_MessageLite;
  this_00 = internal::GetClassData(msg_00);
  arena = MapFieldBase::arena(this);
  ClassData::PlacementNew(this_00,msg,arena);
  return;
}

Assistant:

void InitializeKeyValue(MessageLite* msg) {
    GetClassData(GetMapEntryValuePrototype(*GetPrototype()))
        ->PlacementNew(msg, arena());
  }